

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cShadingLanguage420PackTests.cpp
# Opt level: O2

void __thiscall gl4cts::GLSL420Pack::BindingSamplersTest::releaseResource(BindingSamplersTest *this)

{
  Utils::texture::release(&this->m_goku_texture);
  Utils::texture::release(&this->m_vegeta_texture);
  Utils::texture::release(&this->m_trunks_texture);
  Utils::buffer::release(&this->m_buffer);
  return;
}

Assistant:

void BindingSamplersTest::releaseResource()
{
	m_goku_texture.release();
	m_vegeta_texture.release();
	m_trunks_texture.release();
	m_buffer.release();
}